

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

cmGeneratorTarget * __thiscall
TargetArtifactBase::GetTarget
          (TargetArtifactBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  string *input;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  long *plVar3;
  cmGeneratorTarget *pcVar4;
  size_type *psVar5;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  input = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = cmGeneratorExpression::IsValidTargetName(input);
  if (bVar1) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,input);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      std::operator+(&local_48,"No target \"",input);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_88.field_2._M_allocated_capacity = *psVar5;
        local_88.field_2._8_8_ = plVar3[3];
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar5;
        local_88._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_88._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      reportError(context,&local_68,&local_88);
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (((int)TVar2 < 4) ||
         (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == UNKNOWN_LIBRARY)) {
        if (dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) {
          return this_00;
        }
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(dagChecker,this_00,ANY);
        if (!bVar1) {
          bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
          if (!bVar1) {
            return this_00;
          }
          pcVar4 = cmGeneratorExpressionDAGChecker::TopTarget(dagChecker);
          if (this_00 != pcVar4) {
            return this_00;
          }
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,
                   "Expressions which require the linker language may not be used while evaluating link libraries"
                   ,"");
        reportError(context,&local_68,&local_88);
        goto LAB_005002cc;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      std::operator+(&local_48,"Target \"",input);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_88.field_2._M_allocated_capacity = *psVar5;
        local_88.field_2._8_8_ = plVar3[3];
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar5;
        local_88._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_88._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      reportError(context,&local_68,&local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0050044f;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Expression syntax not recognized.","");
    reportError(context,&local_68,&local_88);
LAB_005002cc:
    local_48.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0050044f;
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_0050044f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return (cmGeneratorTarget *)0x0;
}

Assistant:

cmGeneratorTarget* GetTarget(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const
  {
    // Lookup the referenced target.
    std::string const& name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return nullptr;
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return nullptr;
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return nullptr;
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return nullptr;
    }

    return target;
  }